

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilsTest.hpp
# Opt level: O0

void Qentem::Test::TestCount(QTest *test)

{
  uint local_34 [9];
  QTest *pQStack_10;
  SizeT length;
  QTest *test_local;
  
  pQStack_10 = test;
  local_34[8] = StringUtils::Count<char,unsigned_int>("");
  local_34[7] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_34 + 8,local_34 + 7,0x4b);
  local_34[8] = StringUtils::Count<char,unsigned_int>("a");
  local_34[6] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_34 + 8,local_34 + 6,0x4e);
  local_34[8] = StringUtils::Count<char,unsigned_int>("abcde");
  local_34[5] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_34 + 8,local_34 + 5,0x51);
  local_34[8] = StringUtils::Count<char,unsigned_int>("");
  local_34[4] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_34 + 8,local_34 + 4,0x54);
  local_34[8] = StringUtils::Count<char,unsigned_int>("1234567");
  local_34[3] = 7;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_34 + 8,local_34 + 3,0x57);
  local_34[8] = StringUtils::Count<char,unsigned_int>("123456781234567");
  local_34[2] = 0xf;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_34 + 8,local_34 + 2,0x5a);
  local_34[8] = StringUtils::Count<char,unsigned_int>("1234567812345678123456781234567");
  local_34[1] = 0x1f;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_34 + 8,local_34 + 1,0x5d);
  local_34[8] = StringUtils::Count<char,unsigned_int>
                          ("123456781234567812345678123456781234567812345678123456781234567");
  local_34[0] = 0x3f;
  QTest::IsEqual<unsigned_int,unsigned_int>(pQStack_10,local_34 + 8,local_34,0x60);
  return;
}

Assistant:

static void TestCount(QTest &test) {
    SizeT length = StringUtils::Count("");
    test.IsEqual(length, 0U, __LINE__);

    length = StringUtils::Count("a");
    test.IsEqual(length, 1U, __LINE__);

    length = StringUtils::Count("abcde");
    test.IsEqual(length, 5U, __LINE__);

    length = StringUtils::Count("\0");
    test.IsEqual(length, 0U, __LINE__);

    length = StringUtils::Count("1234567");
    test.IsEqual(length, 7U, __LINE__);

    length = StringUtils::Count("123456781234567");
    test.IsEqual(length, 15U, __LINE__);

    length = StringUtils::Count("1234567812345678123456781234567");
    test.IsEqual(length, 31U, __LINE__);

    length = StringUtils::Count("123456781234567812345678123456781234567812345678123456781234567");
    test.IsEqual(length, 63U, __LINE__);
}